

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_lib.c
# Opt level: O0

int use_proxy(char *no_proxy,char *server)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  char *found;
  size_t sl;
  char *local_28;
  char *local_10;
  uint local_4;
  
  local_28 = (char *)0x0;
  if (in_RSI == (char *)0x0) {
    local_4 = 0;
  }
  else {
    sVar1 = strlen(in_RSI);
    local_10 = in_RDI;
    if (in_RDI == (char *)0x0) {
      local_10 = getenv("no_proxy");
    }
    if (local_10 == (char *)0x0) {
      local_10 = getenv("NO_PROXY");
    }
    if (local_10 != (char *)0x0) {
      local_28 = strstr(local_10,in_RSI);
    }
    while( true ) {
      bVar2 = false;
      if (((local_28 != (char *)0x0) &&
          (((local_28 == local_10 || (local_28[-1] == ' ')) || (bVar2 = true, local_28[-1] == ',')))
          ) && ((bVar2 = false, local_28[sVar1] != '\0' && (bVar2 = false, local_28[sVar1] != ' ')))
         ) {
        bVar2 = local_28[sVar1] != ',';
      }
      if (!bVar2) break;
      local_28 = strstr(local_28 + 1,in_RSI);
    }
    local_4 = (uint)(local_28 == (char *)0x0);
  }
  return local_4;
}

Assistant:

static int use_proxy(const char *no_proxy, const char *server)
{
    size_t sl;
    const char *found = NULL;

    if (!ossl_assert(server != NULL))
        return 0;
    sl = strlen(server);

    /*
     * using environment variable names, both lowercase and uppercase variants,
     * compatible with other HTTP client implementations like wget, curl and git
     */
    if (no_proxy == NULL)
        no_proxy = getenv("no_proxy");
    if (no_proxy == NULL)
        no_proxy = getenv(OPENSSL_NO_PROXY);

    if (no_proxy != NULL)
        found = strstr(no_proxy, server);
    while (found != NULL
           && ((found != no_proxy && found[-1] != ' ' && found[-1] != ',')
               || (found[sl] != '\0' && found[sl] != ' ' && found[sl] != ',')))
        found = strstr(found + 1, server);
    return found == NULL;
}